

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.h
# Opt level: O1

void __thiscall
Js::PseudoActivationObject::MarshalToScriptContext
          (PseudoActivationObject *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/ActivationObject.h"
                                ,0x4d,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00da4fae;
    *puVar3 = 0;
  }
  if ((this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::PseudoActivationObject>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/ActivationObject.h"
                                ,0x4d,
                                "(VirtualTableInfo<PseudoActivationObject>::HasVirtualTable(this))",
                                "Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00da4fae:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::PseudoActivationObject>_>::Address;
  return;
}

Assistant:

PseudoActivationObject(DynamicType * type) : ActivationObject(type) {}